

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absPth.c
# Opt level: O2

void * Abs_ProverThread(void *pArg)

{
  uint __line;
  int iVar1;
  char *pcVar2;
  int level;
  Pdr_Par_t Pars;
  Aig_Man_t *pAig;
  
  Pdr_ManSetDefaultParams(&Pars);
  Pars.fSilent = 1;
  Pars.RunId = *(int *)((long)pArg + 0xc);
  Pars.pFuncStop = Abs_CallBackToStop;
  pAig = *pArg;
  iVar1 = Pdr_ManSolve(pAig,&Pars);
  level = (int)pAig;
  if (iVar1 == 1) {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&g_mutex);
    if (iVar1 != 0) {
      pcVar2 = "status == 0";
      __line = 0x6d;
LAB_004fd373:
      __assert_fail(pcVar2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absPth.c"
                    ,__line,"void *Abs_ProverThread(void *)");
    }
    g_fAbstractionProved = 1;
    level = 0xcd0030;
    iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&g_mutex);
    if (iVar1 != 0) {
      pcVar2 = "status == 0";
      __line = 0x6f;
      goto LAB_004fd373;
    }
    if (*(int *)((long)pArg + 8) == 0) goto LAB_004fd345;
    pcVar2 = "Proved abstraction %d.\n";
  }
  else {
    if (*(int *)((long)pArg + 8) == 0) goto LAB_004fd345;
    if (iVar1 == 0) {
      pcVar2 = "Disproved abstraction %d.\n";
    }
    else {
      if (iVar1 != -1) {
        pcVar2 = "0";
        __line = 0x7a;
        goto LAB_004fd373;
      }
      pcVar2 = "Cancelled abstraction %d.\n";
    }
  }
  Abc_Print(level,pcVar2,(ulong)*(uint *)((long)pArg + 0xc));
LAB_004fd345:
  Aig_ManStop(*pArg);
  free(pArg);
  pthread_exit((void *)0x0);
}

Assistant:

void * Abs_ProverThread( void * pArg )
{
    Abs_ThData_t * pThData = (Abs_ThData_t *)pArg;
    Pdr_Par_t Pars, * pPars = &Pars;
    int RetValue, status;
    // call PDR
    Pdr_ManSetDefaultParams( pPars );
    pPars->fSilent   = 1;
    pPars->RunId     = pThData->RunId;
    pPars->pFuncStop = Abs_CallBackToStop;
    RetValue = Pdr_ManSolve( pThData->pAig, pPars );
    // update the result
    if ( RetValue == 1 )
    {
        status = pthread_mutex_lock(&g_mutex);  assert( status == 0 );
        g_fAbstractionProved = 1;
        status = pthread_mutex_unlock(&g_mutex);  assert( status == 0 );
    }
    // quit this thread
    if ( pThData->fVerbose )
    {
        if ( RetValue == 1 )
            Abc_Print( 1, "Proved abstraction %d.\n", pThData->RunId );
        else if ( RetValue == 0 )
            Abc_Print( 1, "Disproved abstraction %d.\n", pThData->RunId );
        else if ( RetValue == -1 )
            Abc_Print( 1, "Cancelled abstraction %d.\n", pThData->RunId );
        else assert( 0 );
    }
    // free memory
    Aig_ManStop( pThData->pAig );
    ABC_FREE( pThData );
    // quit this thread
    pthread_exit( NULL );
    assert(0);
    return NULL;
}